

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepTiledOutputFile::setFrameBuffer(DeepTiledOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Data *pDVar4;
  pointer ppTVar5;
  _Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  *this_00;
  DeepTiledOutputFile *pDVar6;
  pointer ppTVar7;
  ChannelList *this_01;
  const_iterator cVar8;
  ConstIterator CVar9;
  ConstIterator CVar10;
  const_iterator cVar11;
  Slice *pSVar12;
  pointer ppTVar13;
  ArgExc *pAVar14;
  ostream *poVar15;
  char *pcVar16;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar17;
  size_t i;
  ulong uVar18;
  pointer ppTVar19;
  ulong __n_00;
  value_type local_1d8;
  DeepTiledOutputFile *local_1d0;
  Lock local_1c8;
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  slices;
  
  local_1c8._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_1c8._mutex);
  local_1c8._locked = true;
  this_01 = Header::channels(&this->_data->header);
  for (cVar8._M_node = (_Base_ptr)ChannelList::begin(this_01); CVar9 = ChannelList::end(this_01),
      (const_iterator)cVar8._M_node != CVar9._i._M_node;
      cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node)) {
    CVar10 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar8._M_node + 1));
    cVar11._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar10._i._M_node != (const_iterator)cVar11._M_node) {
      if (cVar8._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar10._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&slices);
        poVar15 = std::operator<<((ostream *)
                                  &slices.
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "Pixel type of \"");
        poVar15 = std::operator<<(poVar15,(char *)(cVar8._M_node + 1));
        poVar15 = std::operator<<(poVar15,"\" channel of output file \"");
        pcVar16 = fileName(this);
        poVar15 = std::operator<<(poVar15,pcVar16);
        std::operator<<(poVar15,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar14,(stringstream *)&slices);
        __cxa_throw(pAVar14,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if ((*(int *)((long)CVar10._i._M_node + 0x140) != 1) ||
         (*(int *)((long)CVar10._i._M_node + 0x144) != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&slices);
        std::operator<<((ostream *)
                        &slices.
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        "All channels in a tiled file must havesampling (1,1).");
        pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar14,(stringstream *)&slices);
        __cxa_throw(pAVar14,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
  }
  pSVar12 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar12->base == (char *)0x0) {
    pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar14,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar14,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pDVar4 = this->_data;
  pDVar4->sampleCountSliceBase = pSVar12->base;
  sVar17 = pSVar12->yStride;
  pDVar4->sampleCountXStride = (int)pSVar12->xStride;
  pDVar4->sampleCountYStride = (int)sVar17;
  pDVar4->sampleCountXTileCoords = (uint)pSVar12->xTileCoords;
  pDVar4->sampleCountYTileCoords = (uint)pSVar12->yTileCoords;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = this;
  cVar8._M_node = (_Base_ptr)ChannelList::begin(this_01);
  for (; CVar9 = ChannelList::end(this_01), pDVar6 = local_1d0,
      (const_iterator)cVar8._M_node != CVar9._i._M_node;
      cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node)) {
    CVar10 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar8._M_node + 1));
    cVar11._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar10._i._M_node == (const_iterator)cVar11._M_node) {
      local_1d8 = (value_type)operator_new(0x38);
      local_1d8->type = cVar8._M_node[9]._M_color;
      local_1d8->sampleStride = 0;
      local_1d8->xStride = 0;
      local_1d8->yStride = 0;
      local_1d8->zero = true;
      local_1d8->xTileCoords = 0;
      local_1d8->yTileCoords = 0;
      std::
      vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ::push_back(&slices,&local_1d8);
    }
    else {
      local_1d8 = (value_type)operator_new(0x38);
      iVar3 = *(int *)((long)CVar10._i._M_node + 0x154);
      bVar1 = *(byte *)((long)CVar10._i._M_node + 0x150);
      bVar2 = *(byte *)((long)CVar10._i._M_node + 0x151);
      local_1d8->type = *(PixelType *)((long)CVar10._i._M_node + 0x120);
      local_1d8->sampleStride = (long)iVar3;
      sVar17 = *(size_t *)((long)CVar10._i._M_node + 0x138);
      local_1d8->xStride = *(size_t *)((long)CVar10._i._M_node + 0x130);
      local_1d8->yStride = sVar17;
      local_1d8->zero = false;
      local_1d8->xTileCoords = (uint)bVar1;
      local_1d8->yTileCoords = (uint)bVar2;
      std::
      vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ::push_back(&slices,&local_1d8);
      slices.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1]->base =
           *(char **)((long)CVar10._i._M_node + 0x128);
    }
  }
  DeepFrameBuffer::operator=(&local_1d0->_data->frameBuffer,frameBuffer);
  uVar18 = 0;
  while( true ) {
    pDVar4 = pDVar6->_data;
    ppTVar13 = (pDVar4->slices).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppTVar5 = (pDVar4->slices).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __n = (long)ppTVar5 - (long)ppTVar13;
    if ((ulong)((long)__n >> 3) <= uVar18) break;
    frameBuffer = (DeepFrameBuffer *)&DAT_00000038;
    operator_delete(ppTVar13[uVar18],0x38);
    uVar18 = uVar18 + 1;
  }
  ppTVar19 = slices.
             super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar7 = slices.
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar18 = (long)slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pDVar4->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar13) < uVar18) {
    ppTVar13 = std::
               _Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                              *)((long)uVar18 >> 3),(size_t)frameBuffer);
    sVar17 = extraout_RDX;
    if (ppTVar7 != ppTVar19) {
      memcpy(ppTVar13,ppTVar19,uVar18);
      sVar17 = extraout_RDX_00;
    }
    this_00 = (_Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
               *)(pDVar4->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
    ::_M_deallocate(this_00,(pointer)((long)(pDVar4->slices).
                                            super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),sVar17);
    (pDVar4->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppTVar13;
    (pDVar4->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppTVar13 + uVar18);
  }
  else {
    if (__n < uVar18) {
      if (ppTVar5 != ppTVar13) {
        memmove(ppTVar13,slices.
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,__n);
        ppTVar5 = (pDVar4->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)ppTVar5 -
              (long)(pDVar4->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      ppTVar13 = ppTVar5;
      ppTVar19 = (pointer)((long)ppTVar19 + __n);
      __n_00 = (long)ppTVar7 - (long)ppTVar19;
      if (__n_00 == 0) goto LAB_001d7f3b;
    }
    else {
      __n_00 = uVar18;
      if (slices.
          super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          slices.
          super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_001d7f3b;
    }
    memmove(ppTVar13,ppTVar19,__n_00);
  }
LAB_001d7f3b:
  (pDVar4->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar18 + (long)(pDVar4->slices).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ::~vector(&slices);
  IlmThread_2_5::Lock::~Lock(&local_1c8);
  return;
}

Assistant:

void
DeepTiledOutputFile::setFrameBuffer (const DeepFrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name());

        if (j == frameBuffer.end())
            continue;

        if (i.channel().type != j.slice().type)
            THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" channel "
                                "of output file \"" << fileName() << "\" is "
                                "not compatible with the frame buffer's "
                                "pixel type.");

        if (j.slice().xSampling != 1 || j.slice().ySampling != 1)
            THROW (IEX_NAMESPACE::ArgExc, "All channels in a tiled file must have"
                                "sampling (1,1).");
    }

    //
    // Store the pixel sample count table.
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = sampleCountSlice.xStride;
        _data->sampleCountYStride = sampleCountSlice.yStride;
        _data->sampleCountXTileCoords = sampleCountSlice.xTileCoords;
        _data->sampleCountYTileCoords = sampleCountSlice.yTileCoords;
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    //

    vector<TOutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name());

        if (j == frameBuffer.end())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new TOutSliceInfo (i.channel().type,
                                                 0, // sampleStride,
                                                 0, // xStride
                                                 0, // yStride
                                                 true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new TOutSliceInfo (j.slice().type,
                                                 j.slice().sampleStride,
                                                 j.slice().xStride,
                                                 j.slice().yStride,
                                                 false, // zero
                                                 (j.slice().xTileCoords)? 1: 0,
                                                 (j.slice().yTileCoords)? 1: 0));

            TOutSliceInfo* slice = slices.back();
            slice->base = j.slice().base;
            
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size(); i++)
        delete _data->slices[i];
    _data->slices = slices;
}